

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgclient.c
# Opt level: O1

int mg_session_run(mg_session *session,char *query,mg_map *params,mg_map *extra_run_information,
                  mg_list **columns,int64_t *qid)

{
  bool bVar1;
  int iVar2;
  mg_value_type mVar3;
  int iVar4;
  mg_value *pmVar5;
  mg_list *pmVar6;
  int64_t iVar7;
  char *fmt;
  mg_message *response;
  mg_message *local_40;
  mg_list **local_38;
  
  iVar2 = session->status;
  if (iVar2 == 2) {
    fmt = "bad session";
LAB_00105371:
    mg_session_set_error(session,fmt);
    return -0xf;
  }
  if ((iVar2 == 1) && (session->explicit_transaction == 0)) {
    fmt = "already executing a query";
    goto LAB_00105371;
  }
  if (iVar2 == 3) {
    fmt = "fetching results of a query";
    goto LAB_00105371;
  }
  local_38 = columns;
  mg_message_destroy_ca((session->result).message,session->decoder_allocator);
  (session->result).message = (mg_message *)0x0;
  mg_list_destroy_ca((session->result).columns,session->allocator);
  (session->result).columns = (mg_list *)0x0;
  if (params == (mg_map *)0x0) {
    params = &mg_empty_map;
  }
  if ((session->version == 4) &&
     ((extra_run_information == (mg_map *)0x0 || (session->explicit_transaction != 0)))) {
    extra_run_information = &mg_empty_map;
  }
  iVar2 = mg_session_send_run_message(session,query,params,extra_run_information);
  if (iVar2 != 0) goto LAB_00105424;
  mg_transport_suspend_until_ready_to_read(session->transport);
  iVar2 = mg_session_receive_message(session);
  if ((iVar2 != 0) || (iVar2 = mg_session_read_bolt_message(session,&local_40), iVar2 != 0))
  goto LAB_00105424;
  if (local_40->type == MG_MESSAGE_TYPE_FAILURE) {
    iVar4 = handle_failure_message(session,(local_40->field_1).failure_v);
    iVar2 = handle_failure(session);
    if (iVar2 == 0) {
      mg_message_destroy_ca(local_40,session->decoder_allocator);
      return iVar4;
    }
    goto LAB_00105424;
  }
  if (local_40->type != MG_MESSAGE_TYPE_SUCCESS) {
    mg_message_destroy_ca(local_40,session->decoder_allocator);
    mg_session_set_error(session,"unexpected message type");
    iVar2 = -10;
    goto LAB_00105424;
  }
  pmVar5 = mg_map_at((mg_map *)((local_40->field_1).init_v)->client_name,"fields");
  if ((pmVar5 == (mg_value *)0x0) ||
     (mVar3 = mg_value_get_type(pmVar5), mVar3 != MG_VALUE_TYPE_LIST)) {
    mg_message_destroy_ca(local_40,session->decoder_allocator);
    mg_session_set_error(session,"invalid response metadata");
    iVar4 = 2;
    iVar2 = -10;
  }
  else {
    pmVar6 = mg_value_list(pmVar5);
    pmVar6 = mg_list_copy_ca(pmVar6,session->allocator);
    (session->result).columns = pmVar6;
    mg_message_destroy_ca(local_40,session->decoder_allocator);
    if ((session->result).columns == (mg_list *)0x0) {
      iVar2 = 0;
      mg_session_set_error(session,"out of memory");
      qid = (int64_t *)0xfffffffd;
    }
    else {
      iVar2 = 0;
      if ((session->version == 4) && (session->explicit_transaction != 0)) {
        if (qid == (int64_t *)0x0) {
          iVar2 = 0;
        }
        else {
          pmVar5 = mg_map_at((mg_map *)((local_40->field_1).init_v)->client_name,"qid");
          if ((pmVar5 == (mg_value *)0x0) ||
             (mVar3 = mg_value_get_type(pmVar5), mVar3 != MG_VALUE_TYPE_INTEGER)) {
            mg_message_destroy_ca(local_40,session->decoder_allocator);
            bVar1 = false;
            mg_session_set_error(session,"invalid response metadata");
            iVar4 = 2;
            iVar2 = -10;
          }
          else {
            iVar7 = mg_value_integer(pmVar5);
            *qid = iVar7;
            bVar1 = true;
            iVar2 = 0;
            iVar4 = 0;
          }
          if (!bVar1) goto LAB_00105623;
        }
        session->query_number = session->query_number + 1;
      }
      if (local_38 != (mg_list **)0x0) {
        *local_38 = (session->result).columns;
      }
      session->status = 1;
      qid = (int64_t *)0x0;
    }
    iVar4 = 1;
  }
LAB_00105623:
  if (iVar4 != 2) {
    return (int)qid;
  }
LAB_00105424:
  mg_session_invalidate(session);
  return iVar2;
}

Assistant:

int mg_session_run(mg_session *session, const char *query, const mg_map *params,
                   const mg_map *extra_run_information, const mg_list **columns,
                   int64_t *qid) {
  if (session->status == MG_SESSION_BAD) {
    mg_session_set_error(session, "bad session");
    return MG_ERROR_BAD_CALL;
  }
  if (!session->explicit_transaction &&
      session->status == MG_SESSION_EXECUTING) {
    mg_session_set_error(session, "already executing a query");
    return MG_ERROR_BAD_CALL;
  }
  if (session->status == MG_SESSION_FETCHING) {
    mg_session_set_error(session, "fetching results of a query");
    return MG_ERROR_BAD_CALL;
  }

  assert(session->status == MG_SESSION_READY ||
         (session->version == 4 && session->explicit_transaction &&
          session->status == MG_SESSION_EXECUTING));

  mg_message_destroy_ca(session->result.message, session->decoder_allocator);
  session->result.message = NULL;
  mg_list_destroy_ca(session->result.columns, session->allocator);
  session->result.columns = NULL;

  if (!params) {
    params = &mg_empty_map;
  }

  // extra field allowed only allowed for Auto-commit Transaction
  // TODO(aandelic): Check if sending extra run information while in Explicit
  // Transaction should result with an error
  if (session->version == 4 &&
      (!extra_run_information || session->explicit_transaction)) {
    extra_run_information = &mg_empty_map;
  }

  int status = 0;
  status = mg_session_send_run_message(session, query, params,
                                       extra_run_information);
  if (status != 0) {
    goto fatal_failure;
  }

  mg_transport_suspend_until_ready_to_read(session->transport);
  status = mg_session_receive_message(session);
  if (status != 0) {
    goto fatal_failure;
  }

  mg_message *response;

  status = mg_session_read_bolt_message(session, &response);
  if (status != 0) {
    goto fatal_failure;
  }

  if (response->type == MG_MESSAGE_TYPE_SUCCESS) {
    const mg_value *columns_tmp =
        mg_map_at(response->success_v->metadata, "fields");
    if (!columns_tmp || mg_value_get_type(columns_tmp) != MG_VALUE_TYPE_LIST) {
      status = MG_ERROR_PROTOCOL_VIOLATION;
      mg_message_destroy_ca(response, session->decoder_allocator);
      mg_session_set_error(session, "invalid response metadata");
      goto fatal_failure;
    }
    session->result.columns =
        mg_list_copy_ca(mg_value_list(columns_tmp), session->allocator);
    mg_message_destroy_ca(response, session->decoder_allocator);
    if (!session->result.columns) {
      mg_session_set_error(session, "out of memory");
      return MG_ERROR_OOM;
    }

    if (session->version == 4 && session->explicit_transaction) {
      if (qid) {
        const mg_value *qid_tmp =
            mg_map_at(response->success_v->metadata, "qid");

        if (!qid_tmp || mg_value_get_type(qid_tmp) != MG_VALUE_TYPE_INTEGER) {
          status = MG_ERROR_PROTOCOL_VIOLATION;
          mg_message_destroy_ca(response, session->decoder_allocator);
          mg_session_set_error(session, "invalid response metadata");
          goto fatal_failure;
        }

        *qid = mg_value_integer(qid_tmp);
      }

      ++session->query_number;
    }

    if (columns) {
      *columns = session->result.columns;
    }

    session->status = MG_SESSION_EXECUTING;
    return 0;
  }

  if (response->type == MG_MESSAGE_TYPE_FAILURE) {
    int failure_status = handle_failure_message(session, response->failure_v);

    status = handle_failure(session);
    if (status != 0) {
      goto fatal_failure;
    }

    mg_message_destroy_ca(response, session->decoder_allocator);
    return failure_status;
  }

  status = MG_ERROR_PROTOCOL_VIOLATION;
  mg_message_destroy_ca(response, session->decoder_allocator);
  mg_session_set_error(session, "unexpected message type");

fatal_failure:
  mg_session_invalidate(session);
  assert(status != 0);
  return status;
}